

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

shared_ptr<QPDFObject> __thiscall QPDF::getObjectForParser(QPDF *this,int id,int gen,bool parse_pdf)

{
  bool bVar1;
  pointer pMVar2;
  size_type sVar3;
  pointer ppVar4;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined4 in_register_00000034;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *this_00;
  byte in_R8B;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar6;
  shared_ptr<QPDFObject> sVar7;
  undefined1 local_f8 [56];
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> local_c0;
  undefined1 local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  QPDFObjGen local_90;
  undefined1 local_88 [56];
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> local_50;
  undefined1 local_48;
  _Self local_40;
  QPDFObjGen local_38;
  iterator iter;
  QPDFObjGen og;
  bool parse_pdf_local;
  int gen_local;
  int id_local;
  QPDF *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  this_00 = (unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *)
            CONCAT44(in_register_00000034,id);
  QPDFObjGen::QPDFObjGen
            ((QPDFObjGen *)((long)&iter._M_node + 4),gen,
             (int)CONCAT71(in_register_00000009,parse_pdf));
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(this_00);
  local_38 = (QPDFObjGen)
             std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::find(&pMVar2->obj_cache,(key_type *)((long)&iter._M_node + 4));
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(this_00);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
       ::end(&pMVar2->obj_cache);
  bVar1 = std::operator!=((_Self *)&local_38,&local_40);
  if (bVar1) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> *)&local_38
                       );
    std::shared_ptr<QPDFObject>::shared_ptr((shared_ptr<QPDFObject> *)this,&(ppVar4->second).object)
    ;
    _Var5._M_pi = extraout_RDX;
  }
  else {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (this_00);
    sVar3 = std::
            map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::count(&pMVar2->xref_table,(key_type *)((long)&iter._M_node + 4));
    if (sVar3 == 0) {
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (this_00);
      if ((pMVar2->parsed & 1U) != 0) {
        if ((in_R8B & 1) == 0) {
          pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                             (this_00);
          QPDFObject::create<QPDF_Null>
                    ((QPDFObject *)local_f8,(QPDF *)this_00,stack0xffffffffffffffd4);
          std::pair<const_QPDFObjGen,_QPDF::ObjCache>::
          pair<QPDFObjGen_&,_std::shared_ptr<QPDFObject>,_true>
                    ((pair<const_QPDFObjGen,_QPDF::ObjCache> *)(local_f8 + 0x10),
                     (QPDFObjGen *)((long)&iter._M_node + 4),(shared_ptr<QPDFObject> *)local_f8);
          pVar6 = std::
                  map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                  ::insert(&pMVar2->obj_cache,(value_type *)(local_f8 + 0x10));
          local_c0 = pVar6.first._M_node;
          local_b8 = pVar6.second;
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                             (&local_c0);
          std::shared_ptr<QPDFObject>::shared_ptr
                    ((shared_ptr<QPDFObject> *)this,&(ppVar4->second).object);
          std::pair<const_QPDFObjGen,_QPDF::ObjCache>::~pair
                    ((pair<const_QPDFObjGen,_QPDF::ObjCache> *)(local_f8 + 0x10));
          std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_f8);
          _Var5._M_pi = extraout_RDX_01;
        }
        else {
          sVar7 = QPDFObject::create<QPDF_Null>();
          _Var5 = sVar7.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
        }
        goto LAB_0038b279;
      }
    }
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (this_00);
    local_90 = stack0xffffffffffffffd4;
    QPDFObject::create<QPDF_Unresolved>
              ((QPDFObject *)local_88,(QPDF *)this_00,stack0xffffffffffffffd4);
    std::pair<const_QPDFObjGen,_QPDF::ObjCache>::
    pair<QPDFObjGen_&,_std::shared_ptr<QPDFObject>,_true>
              ((pair<const_QPDFObjGen,_QPDF::ObjCache> *)(local_88 + 0x10),
               (QPDFObjGen *)((long)&iter._M_node + 4),(shared_ptr<QPDFObject> *)local_88);
    pVar6 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::insert(&pMVar2->obj_cache,(value_type *)(local_88 + 0x10));
    local_b0 = (_Base_ptr)pVar6.first._M_node;
    local_a8 = pVar6.second;
    local_50._M_node = local_b0;
    local_48 = local_a8;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>::operator->
                       (&local_50);
    std::shared_ptr<QPDFObject>::shared_ptr((shared_ptr<QPDFObject> *)this,&(ppVar4->second).object)
    ;
    std::pair<const_QPDFObjGen,_QPDF::ObjCache>::~pair
              ((pair<const_QPDFObjGen,_QPDF::ObjCache> *)(local_88 + 0x10));
    std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_88);
    _Var5._M_pi = extraout_RDX_00;
  }
LAB_0038b279:
  sVar7.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar7.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar7.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF::getObjectForParser(int id, int gen, bool parse_pdf)
{
    // This method is called by the parser and therefore must not resolve any objects.
    auto og = QPDFObjGen(id, gen);
    if (auto iter = m->obj_cache.find(og); iter != m->obj_cache.end()) {
        return iter->second.object;
    }
    if (m->xref_table.count(og) || !m->parsed) {
        return m->obj_cache.insert({og, QPDFObject::create<QPDF_Unresolved>(this, og)})
            .first->second.object;
    }
    if (parse_pdf) {
        return QPDFObject::create<QPDF_Null>();
    }
    return m->obj_cache.insert({og, QPDFObject::create<QPDF_Null>(this, og)}).first->second.object;
}